

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

bool __thiscall
testing::internal::OnCallSpec<void_(SDL_Surface_*)>::Matches
          (OnCallSpec<void_(SDL_Surface_*)> *this,ArgumentTuple *args)

{
  bool bVar1;
  
  bVar1 = MatcherBase<SDL_Surface_*>::Matches
                    ((MatcherBase<SDL_Surface_*> *)(this + 0x10),(SDL_Surface **)args);
  if (bVar1) {
    bVar1 = MatcherBase<const_std::tuple<SDL_Surface_*>_&>::Matches
                      ((MatcherBase<const_std::tuple<SDL_Surface_*>_&> *)(this + 0x28),args);
    return bVar1;
  }
  return false;
}

Assistant:

bool Matches(const ArgumentTuple& args) const {
    return TupleMatches(matchers_, args) && extra_matcher_.Matches(args);
  }